

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       list_caster<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>>
       ::
       cast<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer pvVar1;
  PyObject *tmp;
  handle hVar2;
  long lVar3;
  pointer src_00;
  list l;
  object value_;
  handle local_40;
  object local_38;
  
  list::list((list *)&local_40,
             ((long)(src->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(src->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  src_00 = (src->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (src->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (src_00 != pvVar1) {
    lVar3 = 0;
    do {
      hVar2 = list_caster<std::vector<double,std::allocator<double>>,double>::
              cast<std::vector<double,std::allocator<double>>>(src_00,policy,parent);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        local_38.super_handle = hVar2;
        object::~object(&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_00114532;
      }
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if (((local_40.m_ptr)->ob_type->tp_flags & 0x2000000) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<std::vector<double>>, std::vector<double>>::cast(T &&, return_value_policy, handle) [Type = std::vector<std::vector<double>>, Value = std::vector<double>, T = std::vector<std::vector<double>>]"
                     );
      }
      *(PyObject **)((long)&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar3) =
           hVar2.m_ptr;
      object::~object(&local_38);
      src_00 = src_00 + 1;
      lVar3 = lVar3 + 8;
    } while (src_00 != pvVar1);
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_00114532:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }